

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cansniffer.c
# Opt level: O0

void do_modify_sniftab(uint value,uint mask,char cmd)

{
  int i;
  char cmd_local;
  uint mask_local;
  uint value_local;
  
  for (i = 0; i < idx; i = i + 1) {
    if ((sniftab[i].current.can_id & mask) == (value & mask)) {
      if (cmd == '+') {
        sniftab[i].flags = sniftab[i].flags | 1;
      }
      else {
        sniftab[i].flags = sniftab[i].flags & 0xfffffffe;
      }
    }
  }
  return;
}

Assistant:

void do_modify_sniftab(unsigned int value, unsigned int mask, char cmd)
{
	int i;

	for (i = 0; i < idx ;i++) {
		if ((sniftab[i].current.can_id & mask) == (value & mask)) {
			if (cmd == '+')
				do_set(i, ENABLE);
			else
				do_clr(i, ENABLE);
		}
	}
}